

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Insert<phmap::parallel_node_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Insert<phmap::parallel_node_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  long lVar1;
  pointer *__ptr;
  char *pcVar2;
  tuple<const_phmap::priv::hash_internal::Enum_&> *args_1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *args_1_00;
  T val2;
  T val;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_580;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_578;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_570;
  undefined1 local_568 [8];
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  _Stack_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  ctrl_t *local_548;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_540;
  bool local_538;
  AssertHelper local_530;
  Message local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  undefined1 local_500 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_4d8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4a0;
  
  hash_internal::
  Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::operator()((pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_500,
               (Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                *)&local_4a0);
  lVar1 = 0x40;
  do {
    *(undefined8 *)((long)local_4a0.sets_._M_elems + lVar1 + -0x30) = 0;
    *(undefined8 *)((long)local_4a0.sets_._M_elems + lVar1 + -0x28) = 0;
    *(undefined8 *)((long)&local_4e8 + lVar1 + 8) = 0;
    *(undefined8 *)((long)&local_4d8.first.inner_ + lVar1) = 0;
    *(undefined8 *)((long)local_4a0.sets_._M_elems + lVar1 + -0x18) = 0;
    *(long *)((long)local_4a0.sets_._M_elems + lVar1 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_4a0.sets_._M_elems + lVar1 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4a0.sets_._M_elems[0].set_.ctrl_ + lVar1) = 0;
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x4c0);
  _Stack_560._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_500 + 8);
  args_1 = (tuple<const_phmap::priv::hash_internal::Enum_&> *)local_568;
  local_568 = (undefined1  [8])local_500;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::
  emplace_decomposable_with_hash<phmap::priv::hash_internal::Enum,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::Enum_const&>,std::tuple<std::__cxx11::string_const&>>
            (&local_4d8,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
              *)&local_4a0,
             (Enum *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_500)->_M_allocated_capacity,
             SUB168(ZEXT416((uint)local_500._0_4_) * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(ZEXT416((uint)local_500._0_4_) * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,args_1,
             (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&_Stack_560);
  local_528.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_528.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_4d8.second);
  local_520._M_dataplus._M_p = (pointer)0x0;
  if (local_4d8.second == false) {
    testing::Message::Message((Message *)&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_568,(internal *)&local_528,(AssertionResult *)"p.second","false",
               "true",(char *)args_1);
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x39,(char *)local_568);
    testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    if (local_568 != (undefined1  [8])&local_558) {
      operator_delete((void *)local_568,(ulong)(local_558._M_allocated_capacity + 1));
    }
    if (local_578._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_578._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_520._M_dataplus._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_520,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_520._M_dataplus._M_p);
    }
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>,std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>
            ((internal *)local_568,"val","*p.first",
             (pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_500,*local_4d8.first.it_.field_1.slot_);
  if (local_568[0] == (internal)0x0) {
    testing::Message::Message(&local_528);
    if (_Stack_560._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Stack_560._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((long *)CONCAT44(local_528.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_528.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_528.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_528.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (_Stack_560._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_560,_Stack_560._M_head_impl);
  }
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()((string *)local_568,
             (Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)&local_578);
  local_528.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_500._0_4_;
  if (local_568 == (undefined1  [8])&local_558) {
    local_520.field_2._8_8_ = local_558._8_8_;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  }
  else {
    local_520._M_dataplus._M_p = (pointer)local_568;
  }
  local_520.field_2._M_allocated_capacity = local_558._M_allocated_capacity;
  local_578._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_528;
  local_520._M_string_length = (size_type)_Stack_560._M_head_impl;
  args_1_00 = &local_578;
  local_570._M_head_impl = &local_520;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::
  emplace_decomposable_with_hash<phmap::priv::hash_internal::Enum,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::Enum_const&>,std::tuple<std::__cxx11::string_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_568,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
              *)&local_4a0,(Enum *)local_578._M_head_impl,
             SUB168(ZEXT416((uint)local_500._0_4_) * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(ZEXT416((uint)local_500._0_4_) * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_phmap::priv::hash_internal::Enum_&> *)args_1_00,
             (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_570);
  local_4d8.first.inner_ = (Inner *)local_568;
  local_4d8.first.inner_end_ = (Inner *)_Stack_560._M_head_impl;
  local_4d8.first.it_.ctrl_ = (ctrl_t *)local_558._M_allocated_capacity;
  local_4d8.first.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_558._8_8_;
  local_4d8.first.it_end_.ctrl_ = local_548;
  local_4d8.first.it_end_.field_1 = aStack_540;
  local_4d8.second = local_538;
  local_578._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_578._M_head_impl._1_7_,local_538) ^ 1);
  local_570._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_538 != false) {
    testing::Message::Message((Message *)&local_580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_568,(internal *)&local_578,(AssertionResult *)"p.second","true",
               "false",(char *)args_1_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3d,(char *)local_568);
    testing::internal::AssertHelper::operator=(&local_530,(Message *)&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    if (local_568 != (undefined1  [8])&local_558) {
      operator_delete((void *)local_568,(ulong)(local_558._M_allocated_capacity + 1));
    }
    if (local_580.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_580.data_ + 8))();
    }
    if (local_570._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_570,local_570._M_head_impl);
    }
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>,std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>
            ((internal *)local_568,"val","*p.first",
             (pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_500,*local_4d8.first.it_.field_1.slot_);
  if (local_568[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_578);
    if (_Stack_560._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Stack_560._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    if (local_578._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_578._M_head_impl + 8))();
    }
  }
  if (_Stack_560._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_560,_Stack_560._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,(ulong)(local_520.field_2._M_allocated_capacity + 1))
    ;
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~parallel_hash_set(&local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._8_8_ != &local_4e8) {
    operator_delete((void *)local_500._8_8_,local_4e8._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Insert) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto p = m.insert(val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.insert(val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
}